

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O3

bool spvOpcodeIsAccessChain(Op opcode)

{
  if (((5 < opcode - OpAccessChain) || ((0x27U >> (opcode - OpAccessChain & 0x1f) & 1) == 0)) &&
     (opcode != OpRawAccessChainNV)) {
    return false;
  }
  return true;
}

Assistant:

bool spvOpcodeIsAccessChain(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpRawAccessChainNV:
      return true;
    default:
      return false;
  }
}